

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

void __thiscall Heap<4U>::Heap(Heap<4U> *this,uint32_t _SIZE)

{
  ulong __n;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined8 uVar6;
  Counter *__s;
  long lVar7;
  Counter *pCVar8;
  ulong uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  
  this->heap_num = 0;
  this->SIZE = _SIZE;
  (this->mp)._M_h._M_buckets = &(this->mp)._M_h._M_single_bucket;
  (this->mp)._M_h._M_bucket_count = 1;
  (this->mp)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->mp)._M_h._M_element_count = 0;
  (this->mp)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->mp)._M_h._M_rehash_policy._M_next_resize = (undefined1  [16])0x0;
  __n = (ulong)_SIZE * 8;
  __s = (Counter *)operator_new__(__n);
  if (_SIZE != 0) {
    uVar9 = (ulong)_SIZE + 0x1fffffffffffffff;
    auVar10 = vpbroadcastq_avx512vl();
    auVar2 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    lVar7 = 0;
    auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar1 = vpmovsxbd_avx2(ZEXT816(0x3830282018100800));
    pCVar8 = __s;
    do {
      auVar11 = vpbroadcastq_avx512vl();
      auVar4 = vpor_avx2(auVar11,auVar2);
      auVar11 = vpor_avx2(auVar11,auVar3);
      uVar5 = vpcmpuq_avx512vl(auVar11,auVar10,2);
      uVar6 = vpcmpuq_avx512vl(auVar4,auVar10,2);
      vpscatterdd_avx512vl
                (ZEXT832(pCVar8) + auVar1,(ulong)(byte)((byte)uVar5 & 0xf | (char)uVar6 << 4),
                 SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      lVar7 = lVar7 + 8;
      pCVar8 = pCVar8 + 8;
    } while (((uVar9 & 0x1fffffffffffffff) - (ulong)((uint)uVar9 & 7)) + 8 != lVar7);
  }
  this->heaps = __s;
  memset(__s,0,__n);
  return;
}

Assistant:

Heap(uint32_t _SIZE) : SIZE(_SIZE), heap_num(0) {
		heaps = new Counter[SIZE];
		memset(heaps, 0, SIZE * sizeof(Counter));
	}